

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O2

int sdsull2str(char *s,unsigned_long_long v)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *p;
  char *pcVar4;
  char *pcVar5;
  
  iVar3 = 0;
  pcVar5 = s + -1;
  do {
    pcVar4 = pcVar5;
    pcVar4[1] = (byte)(v % 10) | 0x30;
    pcVar5 = pcVar4 + 1;
    iVar3 = iVar3 + 1;
    bVar2 = 9 < v;
    v = v / 10;
  } while (bVar2);
  pcVar4[2] = '\0';
  for (; s < pcVar5; s = s + 1) {
    cVar1 = *s;
    *s = *pcVar5;
    *pcVar5 = cVar1;
    pcVar5 = pcVar5 + -1;
  }
  return iVar3;
}

Assistant:

int sdsull2str(char *s, unsigned long long v) {
    char *p, aux;
    size_t l;

    /* Generate the string representation, this method produces
     * an reversed string. */
    p = s;
    do {
        *p++ = '0'+(v%10);
        v /= 10;
    } while(v);

    /* Compute length and add null term. */
    l = p-s;
    *p = '\0';

    /* Reverse the string. */
    p--;
    while(s < p) {
        aux = *s;
        *s = *p;
        *p = aux;
        s++;
        p--;
    }
    return l;
}